

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

unsigned_long_long
anon_unknown.dwarf_11255e::ParseLong
          (ExpressionContext *ctx,SynBase *source,char *s,char *e,int base)

{
  char cVar1;
  char *pcVar2;
  unsigned_long_long extraout_RAX;
  char *pos;
  uint uVar3;
  char *pcVar4;
  
  if (s < e) {
    pos = s;
    pcVar4 = (char *)0x0;
    do {
      cVar1 = *pos;
      if ((byte)(cVar1 - 0x30U) < 10) {
        uVar3 = (uint)(byte)(cVar1 - 0x30);
      }
      else {
        uVar3 = ((int)cVar1 & 0xffffffdfU) - 0x37;
      }
      if ((int)uVar3 < 0 || base <= (int)uVar3) {
        ReportAt(ctx,source,pos,"ERROR: digit %d is not allowed in base %d",(ulong)uVar3,base);
      }
      pcVar2 = (char *)((long)pcVar4 * (ulong)(uint)base) + (int)uVar3;
      if (pcVar2 < pcVar4) {
        StopAt(ctx,source,s,(char *)((long)pcVar4 * (ulong)(uint)base));
        return extraout_RAX;
      }
      pos = pos + 1;
      pcVar4 = pcVar2;
    } while (pos != e);
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return (unsigned_long_long)pcVar2;
}

Assistant:

unsigned long long ParseLong(ExpressionContext &ctx, SynBase *source, const char* s, const char* e, int base)
	{
		unsigned long long res = 0;

		for(const char *p = s; p < e; p++)
		{
			int digit = ((*p >= '0' && *p <= '9') ? *p - '0' : (*p & ~0x20) - 'A' + 10);

			if(digit < 0 || digit >= base)
				ReportAt(ctx, source, p, "ERROR: digit %d is not allowed in base %d", digit, base);

			unsigned long long prev = res;

			res = res * base + digit;

			if(res < prev)
				StopAt(ctx, source, s, "ERROR: overflow in integer constant");
		}

		return res;
	}